

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

void __thiscall
kratos::SequentialStmtBlock::add_condition
          (SequentialStmtBlock *this,
          pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *condition)

{
  EventEdgeType edge;
  pointer pEVar1;
  Var *var;
  pointer pEVar2;
  long lVar3;
  long lVar4;
  pointer pEVar5;
  EventControl local_38;
  
  pEVar2 = (this->conditions_).
           super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar1 = (this->conditions_).
           super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar3 = (long)pEVar1 - (long)pEVar2;
  var = (condition->second).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  edge = condition->first;
  pEVar2 = pEVar2 + 2;
  for (lVar4 = lVar3 >> 7; 0 < lVar4; lVar4 = lVar4 + -1) {
    if ((pEVar2[-2].var == var) && (pEVar2[-2].edge == edge)) {
      pEVar5 = pEVar2 + -2;
      goto LAB_0019ee5a;
    }
    if ((pEVar2[-1].var == var) && (pEVar2[-1].edge == edge)) {
      pEVar5 = pEVar2 + -1;
      goto LAB_0019ee5a;
    }
    if ((pEVar2->var == var) && (pEVar5 = pEVar2, pEVar2->edge == edge)) goto LAB_0019ee5a;
    if ((pEVar2[1].var == var) && (pEVar2[1].edge == edge)) {
      pEVar5 = pEVar2 + 1;
      goto LAB_0019ee5a;
    }
    pEVar2 = pEVar2 + 4;
    lVar3 = lVar3 + -0x80;
  }
  lVar3 = lVar3 >> 5;
  pEVar5 = pEVar2 + -2;
  if (lVar3 == 3) {
    if ((pEVar2[-2].var != var) || (pEVar2[-2].edge != edge)) {
      pEVar5 = pEVar2 + -1;
      goto LAB_0019ee73;
    }
  }
  else {
    if (lVar3 == 2) {
LAB_0019ee73:
      if ((pEVar5->var == var) && (pEVar5->edge == edge)) goto LAB_0019ee5a;
      pEVar5 = pEVar5 + 1;
    }
    else if (lVar3 != 1) goto LAB_0019ee8f;
    if ((pEVar5->var != var) || (pEVar5->edge != edge)) goto LAB_0019ee8f;
  }
LAB_0019ee5a:
  if (pEVar5 != pEVar1) {
    return;
  }
LAB_0019ee8f:
  EventControl::EventControl(&local_38,edge,var);
  std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>::
  emplace_back<kratos::EventControl>(&this->conditions_,&local_38);
  return;
}

Assistant:

void SequentialStmtBlock::add_condition(
    const std::pair<EventEdgeType, std::shared_ptr<Var>> &condition) {
    // notice that the condition variable cannot be used as a condition
    // for now we only allow Port (clk and reset) type to use as conditions
    // make sure no duplicate
    auto pos = std::find_if(
        conditions_.begin(), conditions_.end(), [&condition](const EventControl &event) -> bool {
            return event.var == condition.second.get() && event.edge == condition.first;
        });
    if (pos != conditions_.end()) return;

    conditions_.emplace_back(EventControl(condition.first, *condition.second));
}